

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

DdNode * Cudd_zddIthVar(DdManager *dd,int i)

{
  DdNode *pDVar1;
  DdNode *local_48;
  int local_3c;
  int j;
  DdNode *lower;
  DdNode *zvar;
  DdNode *res;
  int i_local;
  DdManager *dd_local;
  
  if ((uint)i < 0x7ffffffe) {
    if (i < dd->sizeZ + -1) {
      local_48 = dd->univ[dd->permZ[i] + 1];
    }
    else {
      local_48 = dd->one;
    }
    do {
      dd->reordered = 0;
      lower = cuddUniqueInterZdd(dd,i,local_48,dd->zero);
    } while (dd->reordered == 1);
    if (lower == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)lower & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)lower & 0xfffffffffffffffe) + 4) + 1;
      local_3c = dd->permZ[i];
      while (local_3c = local_3c + -1, -1 < local_3c) {
        do {
          dd->reordered = 0;
          pDVar1 = cuddUniqueInterZdd(dd,dd->invpermZ[local_3c],lower,lower);
        } while (dd->reordered == 1);
        if (pDVar1 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,lower);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDerefZdd(dd,lower);
        lower = pDVar1;
      }
      *(int *)(((ulong)lower & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)lower & 0xfffffffffffffffe) + 4) + -1;
      dd_local = (DdManager *)lower;
    }
  }
  else {
    dd_local = (DdManager *)0x0;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_zddIthVar(
  DdManager * dd,
  int  i)
{
    DdNode *res;
    DdNode *zvar;
    DdNode *lower;
    int j;

    if ((unsigned int) i >= CUDD_MAXINDEX - 1) return(NULL);

    /* The i-th variable function has the following structure:
    ** at the level corresponding to index i there is a node whose "then"
    ** child points to the universe, and whose "else" child points to zero.
    ** Above that level there are nodes with identical children.
    */

    /* First we build the node at the level of index i. */
    lower = (i < dd->sizeZ - 1) ? dd->univ[dd->permZ[i]+1] : DD_ONE(dd);
    do {
        dd->reordered = 0;
        zvar = cuddUniqueInterZdd(dd, i, lower, DD_ZERO(dd));
    } while (dd->reordered == 1);

    if (zvar == NULL)
        return(NULL);
    cuddRef(zvar);

    /* Now we add the "filler" nodes above the level of index i. */
    for (j = dd->permZ[i] - 1; j >= 0; j--) {
        do {
            dd->reordered = 0;
            res = cuddUniqueInterZdd(dd, dd->invpermZ[j], zvar, zvar);
        } while (dd->reordered == 1);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(dd,zvar);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDerefZdd(dd,zvar);
        zvar = res;
    }
    cuddDeref(zvar);
    return(zvar);

}